

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_switch_label
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  initializer_list<xscript::tokenizer::token_t> __l;
  bool bVar1;
  pointer this_00;
  bool local_179;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> *local_128;
  undefined8 local_120;
  allocator<char> local_111;
  string local_110;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  undefined8 local_d8;
  allocator<char> local_c9;
  string local_c8;
  allocator<xscript::tokenizer::token_t> local_a6;
  less<xscript::tokenizer::token_t> local_a5;
  anon_enum_32 local_a4;
  iterator local_a0;
  size_type local_98;
  set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
  local_90;
  allocator<char> local_49;
  string local_48;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_28;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *node;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  node = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  this_00 = std::
            unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>::
            operator->(parent);
  local_28 = ast_node::add_child(this_00,SWITCH_LABEL);
  bVar1 = tokenizer::token::operator==(&this->cur_token,TK_CASE);
  if (bVar1) {
    parse_token(this,local_28);
    bVar1 = parse_expression(this,local_28);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_49);
      local_a4 = TK_COLON;
      local_a0 = &local_a4;
      local_98 = 1;
      std::allocator<xscript::tokenizer::token_t>::allocator(&local_a6);
      __l._M_len = local_98;
      __l._M_array = local_a0;
      std::
      set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::set(&local_90,__l,&local_a5,&local_a6);
      process_failover(this,&local_48,0x4c1,&local_90,false);
      std::
      set<xscript::tokenizer::token_t,_std::less<xscript::tokenizer::token_t>,_std::allocator<xscript::tokenizer::token_t>_>
      ::~set(&local_90);
      std::allocator<xscript::tokenizer::token_t>::~allocator(&local_a6);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
  }
  else {
    bVar1 = tokenizer::token::operator==(&this->cur_token,TK_DEFAULT);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                 &local_c9);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_f0,"\'case\' or \'default\' expected");
      local_d8 = 1;
      args_00._M_len = 1;
      args_00._M_array = &local_f0;
      local_e0 = &local_f0;
      this_local._7_1_ = append_syntax_error(this,&local_c8,0x4c6,args_00);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      goto LAB_0014dccc;
    }
    parse_token(this,local_28);
  }
  bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_COLON);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
               &local_111);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_138,"\':\' expected");
    local_120 = 1;
    args._M_len = 1;
    args._M_array = &local_138;
    local_128 = &local_138;
    append_syntax_error(this,&local_110,0x4ca,args);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  else {
    next(this);
  }
  do {
    while( true ) {
      bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_CASE);
      local_179 = false;
      if (bVar1) {
        bVar1 = tokenizer::token::operator!=(&this->cur_token,TK_DEFAULT);
        local_179 = false;
        if (bVar1) {
          local_179 = tokenizer::token::operator!=(&this->cur_token,TK_RIGHT_BRACE);
        }
      }
      if (local_179 == false) {
        this_local._7_1_ = 1;
        goto LAB_0014dccc;
      }
      bVar1 = tokenizer::token::operator==(&this->cur_token,TK_LEFT_BRACE);
      if (bVar1) break;
      bVar1 = parse_block_statement(this,local_28);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0014dccc;
      }
    }
    bVar1 = parse_block(this,local_28);
  } while (bVar1);
  this_local._7_1_ = 0;
LAB_0014dccc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ast::parse_switch_label(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(SWITCH_LABEL);

    if (cur_token == tokenizer::TK_CASE) {
        parse_token(node);

        if (!parse_expression(node)) {
            failbefore({tokenizer::TK_COLON});
        }
    } else if (cur_token == tokenizer::TK_DEFAULT) {
        parse_token(node);
    } else {
        return syntax_error({"'case' or 'default' expected"});
    }

    if (cur_token != tokenizer::TK_COLON) {
        syntax_error({"':' expected"});
    } else {
        next();
    }

    while (cur_token != tokenizer::TK_CASE &&
        cur_token != tokenizer::TK_DEFAULT &&
        cur_token != tokenizer::TK_RIGHT_BRACE
    ) {
        if (cur_token == tokenizer::TK_LEFT_BRACE) {
            if (!parse_block(node)) {
                return false;
            }
        } else {
            if (!parse_block_statement(node)) {
                return false;
            }
        }
    }

    return true;
}